

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

ARTConflictType
duckdb::Prefix::Insert
          (ART *art,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
          optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  reference<Node> node_00;
  uint8_t byte;
  GateStatus status_00;
  ARTConflictType AVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000089;
  reference<Node> next;
  idx_t depth_local;
  undefined4 local_5c;
  ARTKey *local_58;
  reference<Node> ref;
  Node leaf;
  Node remainder;
  optional_idx pos;
  
  next._M_data = node;
  depth_local = depth;
  pos = TraverseMutable(art,&next,key,&depth_local);
  node_00._M_data = next._M_data;
  if (pos.index == 0xffffffffffffffff) {
    AVar1 = ART::Insert(art,next._M_data,key,depth_local,row_id,status,delete_art,append_mode);
  }
  else {
    remainder.super_IndexPointer.data = (IndexPointer)0;
    local_58 = row_id;
    iVar2 = optional_idx::GetIndex(&pos);
    local_5c = (undefined4)CONCAT71(in_register_00000089,status);
    byte = GetByte(art,node_00._M_data,(uint8_t)iVar2);
    iVar2 = optional_idx::GetIndex(&pos);
    status_00 = Split(art,&next,&remainder,(uint8_t)iVar2);
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,next._M_data);
    Node::SetGateStatus(next._M_data,status_00);
    Node4::InsertChild(art,next._M_data,byte,remainder);
    if ((char)local_5c == '\x01') {
      uVar4 = *(ulong *)key->data;
      uVar3 = uVar4 & 0xfffffffffffffff8 ^ 0x87;
      Node::InsertChild(art,next._M_data,*(uint8_t *)((long)key->data + depth_local),
                        (Node)(uVar4 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                               (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                               (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                               (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38));
    }
    else {
      ref._M_data = &leaf;
      leaf.super_IndexPointer.data = (IndexPointer)0;
      if (depth_local + 1 < key->len) {
        New(art,&ref,key,depth_local + 1,key->len + ~depth_local);
      }
      uVar4 = *(ulong *)local_58->data & 0xfffffffffffffff8 ^ 0x87;
      ((ref._M_data)->super_IndexPointer).data =
           *(ulong *)local_58->data >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
           (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
           (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
           uVar4 << 0x38;
      Node4::InsertChild(art,next._M_data,key->data[depth_local],leaf);
    }
    AVar1 = NO_CONFLICT;
  }
  return AVar1;
}

Assistant:

ARTConflictType Prefix::Insert(ART &art, Node &node, const ARTKey &key, idx_t depth, const ARTKey &row_id,
                               const GateStatus status, optional_ptr<ART> delete_art,
                               const IndexAppendMode append_mode) {
	reference<Node> next(node);
	auto pos = TraverseMutable(art, next, key, depth);

	// We recurse into the next node, if
	// (1) the prefix matches the key.
	// (2) we reach a gate.
	if (!pos.IsValid()) {
		D_ASSERT(next.get().GetType() != NType::PREFIX || next.get().GetGateStatus() == GateStatus::GATE_SET);
		return art.Insert(next, key, depth, row_id, status, delete_art, append_mode);
	}

	Node remainder;
	auto byte = GetByte(art, next, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	auto split_status = Split(art, next, remainder, UnsafeNumericCast<uint8_t>(pos.GetIndex()));
	Node4::New(art, next);
	next.get().SetGateStatus(split_status);

	// Insert the remaining prefix into the new Node4.
	Node4::InsertChild(art, next, byte, remainder);

	if (status == GateStatus::GATE_SET) {
		D_ASSERT(pos.GetIndex() != ROW_ID_COUNT);
		Node new_row_id;
		Leaf::New(new_row_id, key.GetRowId());
		Node::InsertChild(art, next, key[depth], new_row_id);
		return ARTConflictType::NO_CONFLICT;
	}

	Node leaf;
	reference<Node> ref(leaf);
	if (depth + 1 < key.len) {
		// Create the prefix.
		auto count = key.len - depth - 1;
		Prefix::New(art, ref, key, depth + 1, count);
	}

	// Create the inlined leaf.
	Leaf::New(ref, row_id.GetRowId());
	Node4::InsertChild(art, next, key[depth], leaf);
	return ARTConflictType::NO_CONFLICT;
}